

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<float>
          (Attribute *this,double t,float *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type_conflict4 *pvVar2;
  optional<float> local_48;
  optional<float> local_40;
  optional<float> v;
  TimeSampleInterpolationType tinterp_local;
  float *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (float *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&v,t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&v);
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<float>(&local_48,&this->_var);
      nonstd::optional_lite::optional<float>::optional<float,_0>(&local_40,&local_48);
      nonstd::optional_lite::optional<float>::~optional(&local_48);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_40);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<float>::value(&local_40);
        *dst = *pvVar2;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<float>::~optional(&local_40);
      if (bVar1) goto LAB_0015443b;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ = primvar::PrimVar::get_interpolated_value<float>(&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<float>(this,dst);
    }
  }
LAB_0015443b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }